

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser_members.cpp
# Opt level: O0

IfGenerateSyntax * __thiscall
slang::parsing::Parser::parseIfGenerateConstruct(Parser *this,AttrList attributes)

{
  Token elseKeyword_00;
  bool bVar1;
  ExpressionSyntax *condition_00;
  MemberSyntax *block_00;
  MemberSyntax *clause;
  IfGenerateSyntax *pIVar2;
  Token keyword_00;
  Token openParen_00;
  Token closeParen_00;
  SyntaxList<slang::syntax::AttributeInstanceSyntax> local_c0;
  undefined8 local_90;
  Info *local_88;
  undefined1 local_80 [8];
  Token elseKeyword;
  ElseClauseSyntax *elseClause;
  MemberSyntax *block;
  Token closeParen;
  ExpressionSyntax *condition;
  Token openParen;
  Token keyword;
  Parser *this_local;
  AttrList attributes_local;
  
  keyword_00 = ParserBase::consume(&this->super_ParserBase);
  openParen_00 = ParserBase::expect(&this->super_ParserBase,OpenParenthesis);
  condition_00 = parseExpression(this);
  closeParen_00 = ParserBase::expect(&this->super_ParserBase,CloseParenthesis);
  block_00 = parseGenerateBlock(this);
  elseKeyword.info = (Info *)0x0;
  bVar1 = ParserBase::peek(&this->super_ParserBase,ElseKeyword);
  if (bVar1) {
    _local_80 = ParserBase::consume(&this->super_ParserBase);
    local_90 = local_80;
    local_88 = (Info *)elseKeyword._0_8_;
    clause = parseGenerateBlock(this);
    elseKeyword_00.info = local_88;
    elseKeyword_00.kind = (undefined2)local_90;
    elseKeyword_00._2_1_ = local_90._2_1_;
    elseKeyword_00.numFlags.raw = local_90._3_1_;
    elseKeyword_00.rawLen = local_90._4_4_;
    elseKeyword.info =
         (Info *)slang::syntax::SyntaxFactory::elseClause
                           (&this->factory,elseKeyword_00,&clause->super_SyntaxNode);
  }
  slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>::SyntaxList
            (&local_c0,attributes);
  pIVar2 = slang::syntax::SyntaxFactory::ifGenerate
                     (&this->factory,&local_c0,keyword_00,openParen_00,condition_00,closeParen_00,
                      block_00,(ElseClauseSyntax *)elseKeyword.info);
  return pIVar2;
}

Assistant:

IfGenerateSyntax& Parser::parseIfGenerateConstruct(AttrList attributes) {
    auto keyword = consume();
    auto openParen = expect(TokenKind::OpenParenthesis);
    auto& condition = parseExpression();
    auto closeParen = expect(TokenKind::CloseParenthesis);
    auto& block = parseGenerateBlock();

    ElseClauseSyntax* elseClause = nullptr;
    if (peek(TokenKind::ElseKeyword)) {
        auto elseKeyword = consume();
        elseClause = &factory.elseClause(elseKeyword, parseGenerateBlock());
    }

    return factory.ifGenerate(attributes, keyword, openParen, condition, closeParen, block,
                              elseClause);
}